

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void compress_block(deflate_state *s,ct_data *ltree,ct_data *dtree)

{
  byte bVar1;
  z_Bytef zVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int val_1;
  int iVar7;
  uint uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  int val;
  ulong uVar13;
  
  if (s->last_lit != 0) {
    uVar5 = 0;
    do {
      uVar11 = s->d_buf[uVar5];
      bVar1 = s->l_buf[uVar5];
      if (uVar11 == 0) {
        uVar11 = ltree[bVar1].dl.dad;
        iVar6 = s->bi_valid;
        uVar10 = ltree[bVar1].fc.freq;
        uVar12 = uVar10 << ((byte)iVar6 & 0x1f);
        if ((int)(0x10 - (uint)uVar11) < iVar6) {
          uVar12 = uVar12 | s->bi_buf;
          s->bi_buf = uVar12;
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = (z_Bytef)uVar12;
          zVar2 = *(z_Bytef *)((long)&s->bi_buf + 1);
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = zVar2;
          s->bi_buf = uVar10 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar6 = (uint)uVar11 + s->bi_valid + -0x10;
        }
        else {
          s->bi_buf = s->bi_buf | uVar12;
          iVar6 = iVar6 + (uint)uVar11;
        }
        s->bi_valid = iVar6;
      }
      else {
        uVar13 = (ulong)""[bVar1];
        uVar10 = ltree[uVar13 + 0x101].dl.dad;
        iVar6 = s->bi_valid;
        uVar12 = ltree[uVar13 + 0x101].fc.freq;
        uVar9 = uVar12 << ((byte)iVar6 & 0x1f);
        if ((int)(0x10 - (uint)uVar10) < iVar6) {
          uVar9 = uVar9 | s->bi_buf;
          s->bi_buf = uVar9;
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = (z_Bytef)uVar9;
          zVar2 = *(z_Bytef *)((long)&s->bi_buf + 1);
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = zVar2;
          s->bi_buf = uVar12 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar6 = s->bi_valid + (uint)uVar10 + -0x10;
        }
        else {
          s->bi_buf = s->bi_buf | uVar9;
          iVar6 = iVar6 + (uint)uVar10;
        }
        s->bi_valid = iVar6;
        if (0xffffffffffffffeb < uVar13 - 0x1c) {
          iVar7 = extra_lbits[uVar13];
          iVar4 = base_length[uVar13];
          uVar10 = (ushort)((uint)bVar1 - iVar4 << ((byte)iVar6 & 0x1f));
          if (0x10 - iVar7 < iVar6) {
            uVar10 = uVar10 | s->bi_buf;
            s->bi_buf = uVar10;
            uVar3 = s->pending;
            s->pending = uVar3 + 1;
            s->pending_buf[uVar3] = (z_Bytef)uVar10;
            zVar2 = *(z_Bytef *)((long)&s->bi_buf + 1);
            uVar3 = s->pending;
            s->pending = uVar3 + 1;
            s->pending_buf[uVar3] = zVar2;
            s->bi_buf = (ush)(((uint)bVar1 - iVar4 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar7 = iVar7 + s->bi_valid + -0x10;
          }
          else {
            s->bi_buf = s->bi_buf | uVar10;
            iVar7 = iVar7 + iVar6;
          }
          s->bi_valid = iVar7;
        }
        uVar8 = uVar11 - 1;
        uVar3 = (uVar8 >> 7) + 0x100;
        if (uVar11 < 0x101) {
          uVar3 = uVar8;
        }
        bVar1 = ""[uVar3];
        uVar11 = dtree[bVar1].dl.dad;
        iVar6 = s->bi_valid;
        uVar10 = dtree[bVar1].fc.freq;
        uVar12 = uVar10 << ((byte)iVar6 & 0x1f);
        if ((int)(0x10 - (uint)uVar11) < iVar6) {
          uVar12 = uVar12 | s->bi_buf;
          s->bi_buf = uVar12;
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = (z_Bytef)uVar12;
          zVar2 = *(z_Bytef *)((long)&s->bi_buf + 1);
          uVar3 = s->pending;
          s->pending = uVar3 + 1;
          s->pending_buf[uVar3] = zVar2;
          s->bi_buf = uVar10 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar6 = (uint)uVar11 + s->bi_valid + -0x10;
        }
        else {
          s->bi_buf = s->bi_buf | uVar12;
          iVar6 = iVar6 + (uint)uVar11;
        }
        s->bi_valid = iVar6;
        if (3 < bVar1) {
          iVar7 = extra_dbits[bVar1];
          iVar4 = base_dist[bVar1];
          uVar11 = (ushort)(uVar8 - iVar4 << ((byte)iVar6 & 0x1f));
          if (0x10 - iVar7 < iVar6) {
            uVar11 = uVar11 | s->bi_buf;
            s->bi_buf = uVar11;
            uVar3 = s->pending;
            s->pending = uVar3 + 1;
            s->pending_buf[uVar3] = (z_Bytef)uVar11;
            zVar2 = *(z_Bytef *)((long)&s->bi_buf + 1);
            uVar3 = s->pending;
            s->pending = uVar3 + 1;
            s->pending_buf[uVar3] = zVar2;
            s->bi_buf = (ush)((uVar8 - iVar4 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar7 = iVar7 + s->bi_valid + -0x10;
          }
          else {
            s->bi_buf = s->bi_buf | uVar11;
            iVar7 = iVar7 + iVar6;
          }
          s->bi_valid = iVar7;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < s->last_lit);
  }
  uVar11 = ltree[0x100].dl.dad;
  iVar6 = s->bi_valid;
  uVar10 = ltree[0x100].fc.freq;
  uVar12 = uVar10 << ((byte)iVar6 & 0x1f) | s->bi_buf;
  s->bi_buf = uVar12;
  if ((int)(0x10 - (uint)uVar11) < iVar6) {
    uVar3 = s->pending;
    s->pending = uVar3 + 1;
    s->pending_buf[uVar3] = (z_Bytef)uVar12;
    zVar2 = *(z_Bytef *)((long)&s->bi_buf + 1);
    uVar3 = s->pending;
    s->pending = uVar3 + 1;
    s->pending_buf[uVar3] = zVar2;
    s->bi_buf = uVar10 >> (0x10U - (char)s->bi_valid & 0x1f);
    iVar6 = (uint)uVar11 + s->bi_valid + -0x10;
  }
  else {
    iVar6 = iVar6 + (uint)uVar11;
  }
  s->bi_valid = iVar6;
  s->last_eob_len = (uint)ltree[0x100].dl.dad;
  return;
}

Assistant:

local void compress_block(s, ltree, dtree)
    deflate_state *s;
    ct_data *ltree; /* literal tree */
    ct_data *dtree; /* distance tree */
{
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned lx = 0;    /* running index in l_buf */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (s->last_lit != 0) do {
        dist = s->d_buf[lx];
        lc = s->l_buf[lx++];
        if (dist == 0) {
            send_code(s, lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = _length_code[lc];
            send_code(s, code+LITERALS+1, ltree); /* send the length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(s, lc, extra);       /* send the extra length bits */
            }
            dist--; /* dist is now the match distance - 1 */
            code = d_code(dist);
            Assert (code < D_CODES, "bad d_code");

            send_code(s, code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= base_dist[code];
                send_bits(s, dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */

        /* Check that the overlay between pending_buf and d_buf+l_buf is ok: */
        Assert((uInt)(s->pending) < s->lit_bufsize + 2*lx,
               "pendingBuf overflow");

    } while (lx < s->last_lit);

    send_code(s, END_BLOCK, ltree);
    s->last_eob_len = ltree[END_BLOCK].Len;
}